

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int mtree_bid(archive_read *a,int best_bid)

{
  int iVar1;
  void *__s1;
  size_t sVar2;
  int *unaff_retaddr;
  archive_read *in_stack_00000008;
  char *p;
  char *signature;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  int local_4;
  
  strlen("#mtree");
  __s1 = __archive_read_ahead
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x155a4e);
  if (__s1 == (void *)0x0) {
    local_4 = -1;
  }
  else {
    sVar2 = strlen("#mtree");
    iVar1 = memcmp(__s1,"#mtree",sVar2);
    if (iVar1 == 0) {
      sVar2 = strlen("#mtree");
      local_4 = (int)sVar2 << 3;
    }
    else {
      local_4 = detect_form(in_stack_00000008,unaff_retaddr);
    }
  }
  return local_4;
}

Assistant:

static int
mtree_bid(struct archive_read *a, int best_bid)
{
	const char *signature = "#mtree";
	const char *p;

	(void)best_bid; /* UNUSED */

	/* Now let's look at the actual header and see if it matches. */
	p = __archive_read_ahead(a, strlen(signature), NULL);
	if (p == NULL)
		return (-1);

	if (memcmp(p, signature, strlen(signature)) == 0)
		return (8 * (int)strlen(signature));

	/*
	 * There is not a mtree signature. Let's try to detect mtree format.
	 */
	return (detect_form(a, NULL));
}